

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_versions.cc
# Opt level: O2

bool bssl::ssl_get_version_range
               (SSL_HANDSHAKE *hs,uint16_t *out_min_version,uint16_t *out_max_version)

{
  ushort uVar1;
  uint uVar2;
  SSL_CONFIG *pSVar3;
  bool bVar4;
  int iVar5;
  ushort uVar6;
  uint uVar7;
  int line;
  long lVar8;
  ushort local_2c;
  ushort local_2a;
  
  uVar2 = hs->ssl->options;
  iVar5 = SSL_is_dtls(hs->ssl);
  uVar7 = (uVar2 & 0xefffffff) + (uVar2 & 0x4000000) * 4;
  if (iVar5 == 0) {
    uVar7 = uVar2;
  }
  pSVar3 = hs->config;
  bVar4 = ssl_protocol_version_from_wire(&local_2a,pSVar3->conf_min_version);
  if ((bVar4) && (bVar4 = ssl_protocol_version_from_wire(&local_2c,pSVar3->conf_max_version), bVar4)
     ) {
    iVar5 = SSL_is_quic(hs->ssl);
    uVar6 = 0x304;
    if (0x304 < local_2a) {
      uVar6 = local_2a;
    }
    if (iVar5 == 0) {
      uVar6 = local_2a;
    }
    bVar4 = false;
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      uVar1 = (&kProtocolVersions)[lVar8 * 4];
      if (uVar6 <= uVar1) {
        if (local_2c < uVar1) break;
        if (((&DAT_0021d8b4)[lVar8 * 2] & uVar7) == 0) {
          if (!bVar4) {
            bVar4 = true;
            uVar6 = uVar1;
          }
        }
        else if (bVar4) {
          local_2c = *(ushort *)("DTLSv1.3" + lVar8 * 8 + 6);
          goto LAB_0015ad56;
        }
      }
    }
    if (bVar4) {
LAB_0015ad56:
      *out_min_version = uVar6;
      *out_max_version = local_2c;
      return true;
    }
    iVar5 = 0x118;
    line = 0xf3;
  }
  else {
    iVar5 = 0x44;
    line = 0xc4;
  }
  ERR_put_error(0x10,0,iVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_versions.cc"
                ,line);
  return false;
}

Assistant:

bool ssl_get_version_range(const SSL_HANDSHAKE *hs, uint16_t *out_min_version,
                           uint16_t *out_max_version) {
  // For historical reasons, |SSL_OP_NO_DTLSv1| aliases |SSL_OP_NO_TLSv1|, but
  // DTLS 1.0 should be mapped to TLS 1.1.
  uint32_t options = hs->ssl->options;
  if (SSL_is_dtls(hs->ssl)) {
    options &= ~SSL_OP_NO_TLSv1_1;
    if (options & SSL_OP_NO_DTLSv1) {
      options |= SSL_OP_NO_TLSv1_1;
    }
  }

  uint16_t min_version, max_version;
  if (!ssl_protocol_version_from_wire(&min_version,
                                      hs->config->conf_min_version) ||
      !ssl_protocol_version_from_wire(&max_version,
                                      hs->config->conf_max_version)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  // QUIC requires TLS 1.3.
  if (SSL_is_quic(hs->ssl) && min_version < TLS1_3_VERSION) {
    min_version = TLS1_3_VERSION;
  }

  // The |SSL_OP_NO_*| flags disable individual protocols. This has two
  // problems. First, prior to TLS 1.3, the protocol can only express a
  // contiguous range of versions. Second, a library consumer trying to set a
  // maximum version cannot disable protocol versions that get added in a future
  // version of the library.
  //
  // To account for both of these, OpenSSL interprets the client-side bitmask
  // as a min/max range by picking the lowest contiguous non-empty range of
  // enabled protocols. Note that this means it is impossible to set a maximum
  // version of the higest supported TLS version in a future-proof way.
  bool any_enabled = false;
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kProtocolVersions); i++) {
    // Only look at the versions already enabled.
    if (min_version > kProtocolVersions[i].version) {
      continue;
    }
    if (max_version < kProtocolVersions[i].version) {
      break;
    }

    if (!(options & kProtocolVersions[i].flag)) {
      // The minimum version is the first enabled version.
      if (!any_enabled) {
        any_enabled = true;
        min_version = kProtocolVersions[i].version;
      }
      continue;
    }

    // If there is a disabled version after the first enabled one, all versions
    // after it are implicitly disabled.
    if (any_enabled) {
      max_version = kProtocolVersions[i - 1].version;
      break;
    }
  }

  if (!any_enabled) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_NO_SUPPORTED_VERSIONS_ENABLED);
    return false;
  }

  *out_min_version = min_version;
  *out_max_version = max_version;
  return true;
}